

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O3

int Acb_NtkCheckPiOrder(Acb_Ntk_t *pNtkF,Acb_Ntk_t *pNtkG)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *__s1;
  char *__s2;
  long lVar5;
  
  iVar1 = (pNtkF->vCis).nSize;
  lVar5 = 0;
  if ((long)iVar1 < 1) {
LAB_003ae384:
    if ((int)lVar5 != iVar1) {
      return 0;
    }
  }
  else {
    lVar5 = 0;
    do {
      if ((pNtkF->vCis).nSize <= lVar5) {
LAB_003ae3ab:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = (pNtkF->vCis).pArray[lVar5];
      if ((long)(int)uVar2 < 1) {
LAB_003ae3ca:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0x10e,"char *Acb_ObjNameStr(Acb_Ntk_t *, int)");
      }
      uVar3 = (pNtkF->vObjName).nSize;
      if ((int)uVar3 < 1) {
LAB_003ae3e9:
        __assert_fail("Acb_NtkHasObjNames(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
      }
      if ((uVar3 <= uVar2) ||
         (__s1 = Abc_NamStr(pNtkF->pDesign->pStrs,(pNtkF->vObjName).pArray[(int)uVar2]),
         (pNtkG->vCis).nSize <= lVar5)) goto LAB_003ae3ab;
      uVar2 = (pNtkG->vCis).pArray[lVar5];
      if ((long)(int)uVar2 < 1) goto LAB_003ae3ca;
      uVar3 = (pNtkG->vObjName).nSize;
      if ((int)uVar3 < 1) goto LAB_003ae3e9;
      if (uVar3 <= uVar2) goto LAB_003ae3ab;
      __s2 = Abc_NamStr(pNtkG->pDesign->pStrs,(pNtkG->vObjName).pArray[(int)uVar2]);
      iVar4 = strcmp(__s1,__s2);
      if (iVar4 != 0) {
        puts("Networks have different PI names. Reordering PIs of the implementation network.");
        Acb_NtkUpdateCiOrder(pNtkF,pNtkG);
        goto LAB_003ae384;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  puts("Networks have the same PI names.");
  return 1;
}

Assistant:

int Acb_NtkCheckPiOrder( Acb_Ntk_t * pNtkF, Acb_Ntk_t * pNtkG )
{
    int i, nPis = Acb_NtkCiNum(pNtkF);
    for ( i = 0; i < nPis; i++ )
    {
        char * pNameF = Acb_ObjNameStr( pNtkF, Acb_NtkCi(pNtkF, i) );
        char * pNameG = Acb_ObjNameStr( pNtkG, Acb_NtkCi(pNtkG, i) );
        if ( strcmp(pNameF, pNameG) )
        {
//            printf( "PI %d has different names (%s and %s) in these networks.\n", i, pNameF, pNameG );
            printf( "Networks have different PI names. Reordering PIs of the implementation network.\n" );
            Acb_NtkUpdateCiOrder( pNtkF, pNtkG );
            break;
        }
    }
    if ( i == nPis )
        printf( "Networks have the same PI names.\n" );
    return i == nPis;
}